

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  reference ppcVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_02;
  reference ppcVar4;
  ostream *poVar5;
  undefined1 local_90 [8];
  string tname;
  cmGeneratorTarget *gt;
  cmGeneratorTarget *tgt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  cmLocalGenerator *lGenerator;
  iterator __end1;
  iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  cmLocalUnixMakefileGenerator3 *lg;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators_local;
  cmGeneratedFileStream *cmakefileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  std::operator<<((ostream *)cmakefileStream,"# Dependency information for all targets:\n");
  std::operator<<((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n");
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lGenerators);
  lGenerator = (cmLocalGenerator *)
               std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                         (lGenerators);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                *)&lGenerator);
    if (!bVar1) {
      std::operator<<((ostream *)cmakefileStream,"  )\n");
      return;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    this_00 = (cmLocalUnixMakefileGenerator3 *)*ppcVar3;
    this_02 = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this_00);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_02);
    tgt = (cmGeneratorTarget *)
          std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_02);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                  *)&tgt);
      if (!bVar1) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      this_01 = *ppcVar4;
      TVar2 = cmGeneratorTarget::GetType(this_01);
      if (TVar2 == EXECUTABLE) {
LAB_004791fc:
        tname.field_2._8_8_ = this_01;
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)local_90,this_00,this_01);
        std::__cxx11::string::operator+=((string *)local_90,"/DependInfo.cmake");
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_90);
        poVar5 = std::operator<<((ostream *)cmakefileStream,"  \"");
        poVar5 = std::operator<<(poVar5,(string *)local_90);
        std::operator<<(poVar5,"\"\n");
        std::__cxx11::string::~string((string *)local_90);
      }
      else {
        TVar2 = cmGeneratorTarget::GetType(this_01);
        if (TVar2 == STATIC_LIBRARY) goto LAB_004791fc;
        TVar2 = cmGeneratorTarget::GetType(this_01);
        if (TVar2 == SHARED_LIBRARY) goto LAB_004791fc;
        TVar2 = cmGeneratorTarget::GetType(this_01);
        if (TVar2 == MODULE_LIBRARY) goto LAB_004791fc;
        TVar2 = cmGeneratorTarget::GetType(this_01);
        if (TVar2 == OBJECT_LIBRARY) goto LAB_004791fc;
        TVar2 = cmGeneratorTarget::GetType(this_01);
        if (TVar2 == UTILITY) goto LAB_004791fc;
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules(
  cmGeneratedFileStream& cmakefileStream,
  std::vector<cmLocalGenerator*>& lGenerators)
{
  cmLocalUnixMakefileGenerator3* lg;

  // now list all the target info files
  cmakefileStream << "# Dependency information for all targets:\n";
  cmakefileStream << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (cmLocalGenerator* lGenerator : lGenerators) {
    lg = static_cast<cmLocalUnixMakefileGenerator3*>(lGenerator);
    // for all of out targets
    for (cmGeneratorTarget* tgt : lg->GetGeneratorTargets()) {
      if ((tgt->GetType() == cmStateEnums::EXECUTABLE) ||
          (tgt->GetType() == cmStateEnums::STATIC_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::SHARED_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::MODULE_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) ||
          (tgt->GetType() == cmStateEnums::UTILITY)) {
        cmGeneratorTarget* gt = tgt;
        std::string tname = lg->GetRelativeTargetDirectory(gt);
        tname += "/DependInfo.cmake";
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
      }
    }
  }
  cmakefileStream << "  )\n";
}